

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O2

void __thiscall VulkanUtilities::VulkanCommandBuffer::EndRenderPass(VulkanCommandBuffer *this)

{
  char (*in_RCX) [32];
  VkCommandBuffer pVVar1;
  string msg;
  
  if ((this->m_State).RenderPass == (VkRenderPass)0x0) {
    Diligent::FormatString<char[33]>(&msg,(char (*) [33])"Render pass has not been started");
    in_RCX = (char (*) [32])0x14d;
    Diligent::DebugAssertionFailed
              (msg._M_dataplus._M_p,"EndRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x14d);
    std::__cxx11::string::~string((string *)&msg);
  }
  pVVar1 = this->m_VkCmdBuffer;
  if (pVVar1 == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",in_RCX);
    Diligent::DebugAssertionFailed
              (msg._M_dataplus._M_p,"EndRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x14e);
    std::__cxx11::string::~string((string *)&msg);
    pVVar1 = this->m_VkCmdBuffer;
  }
  (*vkCmdEndRenderPass)(pVVar1);
  (this->m_State).FramebufferWidth = 0;
  (this->m_State).FramebufferHeight = 0;
  (this->m_State).RenderPass = (VkRenderPass)0x0;
  (this->m_State).Framebuffer = (VkFramebuffer)0x0;
  if ((this->m_State).InsidePassQueries != 0) {
    Diligent::FormatString<char[435]>
              (&msg,(char (*) [435])
                    "Ending render pass while there are outstanding queries that have been started inside the pass, but have not been ended. Vulkan requires that a query must either begin and end inside the same subpass of a render pass instance, or must both begin and end outside of a render pass instance (i.e. contain entire render pass instances). (https://registry.khronos.org/vulkan/specs/latest/html/vkspec.html#VUID-vkCmdEndRenderPass-None-07004)"
              );
    if (Diligent::DebugMessageCallback != (undefined *)0x0) {
      (*(code *)Diligent::DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
    }
    std::__cxx11::string::~string((string *)&msg);
  }
  return;
}

Assistant:

__forceinline void EndRenderPass()
    {
        VERIFY(m_State.RenderPass != VK_NULL_HANDLE, "Render pass has not been started");
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        vkCmdEndRenderPass(m_VkCmdBuffer);
        m_State.RenderPass        = VK_NULL_HANDLE;
        m_State.Framebuffer       = VK_NULL_HANDLE;
        m_State.FramebufferWidth  = 0;
        m_State.FramebufferHeight = 0;
        if (m_State.InsidePassQueries != 0)
        {
            LOG_ERROR_MESSAGE("Ending render pass while there are outstanding queries that have been started inside the pass, "
                              "but have not been ended. Vulkan requires that a query must either begin and end inside the same "
                              "subpass of a render pass instance, or must both begin and end outside of a render pass "
                              "instance (i.e. contain entire render pass instances). "
                              "(https://registry.khronos.org/vulkan/specs/latest/html/vkspec.html#VUID-vkCmdEndRenderPass-None-07004)");
        }
    }